

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXSpectrum.cpp
# Opt level: O1

unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_> __thiscall
Sinclair::ZXSpectrum::ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0>::get_options
          (ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0> *this)

{
  Display DVar1;
  Options *this_00;
  Display DVar2;
  long in_RSI;
  
  this_00 = (Options *)operator_new(0x10);
  ZXSpectrum::Machine::Options::Options(this_00,UserFriendly);
  this_00->automatic_tape_motor_control = *(bool *)(in_RSI + 0x359f9);
  (this_00->super_QuickloadOption<Sinclair::ZXSpectrum::Machine::Options>).quickload =
       *(bool *)(in_RSI + 0x35a0c);
  DVar1 = (**(code **)(*(long *)(in_RSI + 0xe8) + 0x20))(in_RSI + 0xe8);
  DVar2 = RGB;
  if (DVar1 - SVideo < 3) {
    DVar2 = DVar1;
  }
  (this_00->super_DisplayOption<Sinclair::ZXSpectrum::Machine::Options>).output = DVar2;
  (this->super_Source)._vptr_Source = (_func_int **)this_00;
  return (__uniq_ptr_data<Reflection::Struct,_std::default_delete<Reflection::Struct>,_true,_true>)
         (__uniq_ptr_data<Reflection::Struct,_std::default_delete<Reflection::Struct>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Reflection::Struct> get_options() override {
			auto options = std::make_unique<Options>(Configurable::OptionsType::UserFriendly);	// OptionsType is arbitrary, but not optional.
			options->automatic_tape_motor_control = use_automatic_tape_motor_control_;
			options->quickload = allow_fast_tape_hack_;
			options->output = get_video_signal_configurable();
			return options;
		}